

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_transaction.cpp
# Opt level: O2

CreateSignatureHashResponseStruct *
cfd::js::api::TransactionStructApi::GetSighash
          (CreateSignatureHashResponseStruct *__return_storage_ptr__,
          GetSighashRequestStruct *request)

{
  string *in_R8;
  allocator local_119;
  _Any_data local_118;
  code *local_108;
  code *local_100;
  function<cfd::js::api::CreateSignatureHashResponseStruct_(const_cfd::js::api::GetSighashRequestStruct_&)>
  local_f8;
  CreateSignatureHashResponseStruct local_d8;
  
  CreateSignatureHashResponseStruct::CreateSignatureHashResponseStruct(__return_storage_ptr__);
  local_118._M_unused._M_object = (void *)0x0;
  local_118._8_8_ = 0;
  local_100 = std::
              _Function_handler<cfd::js::api::CreateSignatureHashResponseStruct_(const_cfd::js::api::GetSighashRequestStruct_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/src/cfdjs_transaction.cpp:608:20)>
              ::_M_invoke;
  local_108 = std::
              _Function_handler<cfd::js::api::CreateSignatureHashResponseStruct_(const_cfd::js::api::GetSighashRequestStruct_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/src/cfdjs_transaction.cpp:608:20)>
              ::_M_manager;
  std::__cxx11::string::string((string *)&local_f8,"GetSighash",&local_119);
  ExecuteStructApi<cfd::js::api::GetSighashRequestStruct,cfd::js::api::CreateSignatureHashResponseStruct>
            (&local_d8,(api *)request,(GetSighashRequestStruct *)&local_118,&local_f8,in_R8);
  CreateSignatureHashResponseStruct::operator=(__return_storage_ptr__,&local_d8);
  CreateSignatureHashResponseStruct::~CreateSignatureHashResponseStruct(&local_d8);
  std::__cxx11::string::~string((string *)&local_f8);
  std::_Function_base::~_Function_base((_Function_base *)&local_118);
  return __return_storage_ptr__;
}

Assistant:

CreateSignatureHashResponseStruct TransactionStructApi::GetSighash(
    const GetSighashRequestStruct& request) {
  auto call_func = [](const GetSighashRequestStruct& request)
      -> CreateSignatureHashResponseStruct {  // NOLINT
    CreateSignatureHashResponseStruct response;
    TransactionContext tx(request.tx);
    AddressFactory factory;
    auto utxo_list =
        TransactionStructApiBase::ConvertUtxoList(request.utxos, &factory);
    tx.CollectInputUtxo(utxo_list);

    AddressType addr_type =
        AddressApiBase::ConvertAddressType(request.txin.hash_type);
    OutPoint outpoint(Txid(request.txin.txid), request.txin.vout);
    bool has_taproot = (addr_type == AddressType::kTaprootAddress);
    SigHashType sighashtype = TransactionStructApiBase::ConvertSigHashType(
        request.txin.sighash_type, request.txin.sighash_anyone_can_pay,
        request.txin.sighash_rangeproof, has_taproot);

    Script redeem_script;
    bool is_pubkey = false;
    if (request.txin.key_data.type == "pubkey") {
      is_pubkey = true;
    } else if (request.txin.key_data.type == "redeem_script") {
      redeem_script = Script(request.txin.key_data.hex);
    }

    if (has_taproot) {
      SchnorrPubkey pubkey;
      if (is_pubkey) pubkey = SchnorrPubkey(request.txin.key_data.hex);
      ByteData annex(request.txin.annex);
      uint32_t pos =
          static_cast<uint32_t>(request.txin.code_separator_position);
      ByteData256 tapleaf_hash;
      if (!is_pubkey) {
        TaprootScriptTree tree(redeem_script);
        tapleaf_hash = tree.GetTapLeafHash();
      }
      auto sighash = tx.CreateSignatureHashByTaproot(
          outpoint, sighashtype, (is_pubkey) ? nullptr : &tapleaf_hash,
          (request.txin.code_separator_position < 0) ? nullptr : &pos,
          (annex.IsEmpty()) ? nullptr : &annex);
      response.sighash = sighash.GetHex();
    } else {
      WitnessVersion version = WitnessVersion::kVersion0;
      if ((addr_type == AddressType::kP2pkhAddress) ||
          (addr_type == AddressType::kP2shAddress)) {
        version = WitnessVersion::kVersionNone;
      }
      auto utxo = tx.GetTxInUtxoData(outpoint);
      ByteData sighash;
      if (is_pubkey) {
        Pubkey pubkey(request.txin.key_data.hex);
        sighash = tx.CreateSignatureHash(
            outpoint, pubkey, sighashtype, utxo.amount, version);
      } else {
        sighash = tx.CreateSignatureHash(
            outpoint, redeem_script, sighashtype, utxo.amount, version);
      }
      response.sighash = sighash.GetHex();
    }
    return response;
  };

  CreateSignatureHashResponseStruct result;
  result = ExecuteStructApi<
      GetSighashRequestStruct, CreateSignatureHashResponseStruct>(
      request, call_func, std::string(__FUNCTION__));
  return result;
}